

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O0

bool __thiscall OSTEI_Writer::IsSpecialPermutation_(OSTEI_Writer *this,QAM *am)

{
  int *piVar1;
  QAM *in_RSI;
  int i;
  
  i = (int)((ulong)in_RSI >> 0x20);
  piVar1 = QAM::operator[](in_RSI,i);
  if (((*piVar1 == 0) && (piVar1 = QAM::operator[](in_RSI,i), 0 < *piVar1)) &&
     ((piVar1 = QAM::operator[](in_RSI,i), *piVar1 == 0 ||
      (piVar1 = QAM::operator[](in_RSI,i), *piVar1 == 0)))) {
    return true;
  }
  piVar1 = QAM::operator[](in_RSI,i);
  if (((*piVar1 == 0) && (piVar1 = QAM::operator[](in_RSI,i), 0 < *piVar1)) &&
     ((piVar1 = QAM::operator[](in_RSI,i), *piVar1 == 0 ||
      (piVar1 = QAM::operator[](in_RSI,i), *piVar1 == 0)))) {
    return true;
  }
  return false;
}

Assistant:

bool OSTEI_Writer::IsSpecialPermutation_(QAM am) const
{
    // is this a special permutation? Handle it that way if it is
    // NOTE: We never switch bra/ket, since that would affect the
    //       vectorization (since we vectorize on the ket)
    if( ( am[0] == 0 && am[1] > 0 ) && ( am[2] == 0 || am[3] == 0 ) )
        return true;
    if( ( am[2] == 0 && am[3] > 0 ) && ( am[0] == 0 || am[1] == 0 ) )
        return true;

    return false;
}